

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

CalculatedFloat
absl::anon_unknown_0::CalculateFromParsedDecimal<double>(ParsedFloat *parsed_decimal)

{
  uint128 value;
  uint128 other;
  bool bVar1;
  uint64_t v;
  unsigned_long *in_RDI;
  CalculatedFloat CVar2;
  uint64_t binary_mantissa;
  bool result_exact;
  int shift;
  int mantissa_width;
  bool mantissa_exact;
  int binary_exponent;
  uint128 wide_binary_mantissa;
  CalculatedFloat result;
  Nonnull<bool_*> in_stack_00000100;
  bool in_stack_0000010b;
  int in_stack_0000010c;
  undefined1 in_stack_00000110 [16];
  ParsedFloat *in_stack_00000378;
  int in_stack_00000384;
  uint64_t in_stack_00000388;
  undefined8 in_stack_ffffffffffffff68;
  int exponent;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Nonnull<uint128_*> in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint64_t in_stack_ffffffffffffffb8;
  uint128 local_38;
  CalculatedFloat local_28;
  unsigned_long *local_18;
  uint64_t local_10;
  int local_8;
  
  exponent = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_18 = in_RDI;
  CalculatedFloat::CalculatedFloat(&local_28);
  bVar1 = Power10Underflow((int)local_18[1]);
  if (bVar1) {
    local_10 = local_28.mantissa;
    local_8 = -99999;
  }
  else {
    bVar1 = Power10Overflow((int)local_18[1]);
    if (bVar1) {
      local_10 = local_28.mantissa;
      local_8 = 99999;
    }
    else {
      uint128::uint128(&local_38,*local_18);
      v = Power10Mantissa((int)local_18[1]);
      uint128::uint128((uint128 *)&stack0xffffffffffffffb8,v);
      other.lo_._4_4_ = in_stack_ffffffffffffffb4;
      other.lo_._0_4_ = in_stack_ffffffffffffffb0;
      other.hi_ = in_stack_ffffffffffffffb8;
      uint128::operator*=((uint128 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          other);
      Power10Exponent((int)local_18[1]);
      if (local_18[3] == 0) {
        bVar1 = Power10Exact((int)local_18[1]);
        if (bVar1) {
          value.lo_._4_4_ = in_stack_ffffffffffffff94;
          value.lo_._0_4_ = in_stack_ffffffffffffff90;
          value.hi_ = local_38.lo_;
          BitWidth(value);
        }
        else {
          TruncateToBitWidth(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
        }
      }
      else {
        TruncateToBitWidth(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
      }
      NormalizedShiftSize<double>(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      ShiftRightAndRound((uint128)in_stack_00000110,in_stack_0000010c,in_stack_0000010b,
                         in_stack_00000100);
      if ((in_stack_ffffffffffffff90 & 0x1000000) == 0) {
        MustRoundUp(in_stack_00000388,in_stack_00000384,in_stack_00000378);
      }
      CVar2 = CalculatedFloatFromRawValues<double>
                        (CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),exponent);
      local_10 = CVar2.mantissa;
      local_8 = CVar2.exponent;
    }
  }
  CVar2.exponent = local_8;
  CVar2.mantissa = local_10;
  CVar2._12_4_ = 0;
  return CVar2;
}

Assistant:

CalculatedFloat CalculateFromParsedDecimal(
    const strings_internal::ParsedFloat& parsed_decimal) {
  CalculatedFloat result;

  // Large or small enough decimal exponents will always result in overflow
  // or underflow.
  if (Power10Underflow(parsed_decimal.exponent)) {
    result.exponent = kUnderflow;
    return result;
  } else if (Power10Overflow(parsed_decimal.exponent)) {
    result.exponent = kOverflow;
    return result;
  }

  // Otherwise convert our power of 10 into a power of 2 times an integer
  // mantissa, and multiply this by our parsed decimal mantissa.
  uint128 wide_binary_mantissa = parsed_decimal.mantissa;
  wide_binary_mantissa *= Power10Mantissa(parsed_decimal.exponent);
  int binary_exponent = Power10Exponent(parsed_decimal.exponent);

  // Discard bits that are inaccurate due to truncation error.  The magic
  // `mantissa_width` constants below are justified in
  // https://abseil.io/about/design/charconv. They represent the number of bits
  // in `wide_binary_mantissa` that are guaranteed to be unaffected by error
  // propagation.
  bool mantissa_exact;
  int mantissa_width;
  if (parsed_decimal.subrange_begin) {
    // Truncated mantissa
    mantissa_width = 58;
    mantissa_exact = false;
    binary_exponent +=
        TruncateToBitWidth(mantissa_width, &wide_binary_mantissa);
  } else if (!Power10Exact(parsed_decimal.exponent)) {
    // Exact mantissa, truncated power of ten
    mantissa_width = 63;
    mantissa_exact = false;
    binary_exponent +=
        TruncateToBitWidth(mantissa_width, &wide_binary_mantissa);
  } else {
    // Product is exact
    mantissa_width = BitWidth(wide_binary_mantissa);
    mantissa_exact = true;
  }

  // Shift into an FloatType-sized mantissa, and round to nearest.
  const int shift =
      NormalizedShiftSize<FloatType>(mantissa_width, binary_exponent);
  bool result_exact;
  binary_exponent += shift;
  uint64_t binary_mantissa = ShiftRightAndRound(wide_binary_mantissa, shift,
                                                mantissa_exact, &result_exact);
  if (!result_exact) {
    // We could not determine the rounding direction using int128 math.  Use
    // full resolution math instead.
    if (MustRoundUp(binary_mantissa, binary_exponent, parsed_decimal)) {
      binary_mantissa += 1;
    }
  }

  return CalculatedFloatFromRawValues<FloatType>(binary_mantissa,
                                                 binary_exponent);
}